

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

deInt32 __thiscall
sglr::ReferenceContext::getAttribLocation(ReferenceContext *this,deUint32 program,char *name)

{
  pointer pbVar1;
  __type _Var2;
  ShaderProgramObjectContainer *pSVar3;
  size_t ndx;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  allocator<char> local_49;
  string nameString;
  
  pSVar3 = rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::find
                     (&this->m_programs,program);
  if (pSVar3 == (ShaderProgramObjectContainer *)0x0) {
    uVar4 = 0xffffffffffffffff;
    if (this->m_lastError == 0) {
      this->m_lastError = 0x502;
    }
  }
  else {
    if (name != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&nameString,name,&local_49);
      lVar5 = 0;
      uVar4 = 0;
      while( true ) {
        pbVar1 = (pSVar3->m_program->m_attributeNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = (long)(pSVar3->m_program->m_attributeNames).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
        if (uVar6 <= uVar4) break;
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(pbVar1->_M_dataplus)._M_p + lVar5),&nameString);
        if (_Var2) break;
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x20;
      }
      std::__cxx11::string::~string((string *)&nameString);
      if (uVar4 < uVar6) goto LAB_0088b6f6;
    }
    uVar4 = 0xffffffffffffffff;
  }
LAB_0088b6f6:
  return (deInt32)uVar4;
}

Assistant:

deInt32 ReferenceContext::getAttribLocation (deUint32 program, const char *name)
{
	ShaderProgramObjectContainer* shaderProg = m_programs.find(program);

	RC_IF_ERROR(shaderProg == DE_NULL, GL_INVALID_OPERATION, -1);

	if (name)
	{
		std::string nameString(name);

		for (size_t ndx = 0; ndx < shaderProg->m_program->m_attributeNames.size(); ++ndx)
			if (shaderProg->m_program->m_attributeNames[ndx] == nameString)
				return (int)ndx;
	}

	return -1;
}